

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O2

NamespaceAliasDeclaration * __thiscall
soul::ResolutionPass::NamespaceAliasResolver::visit
          (NamespaceAliasResolver *this,NamespaceAliasDeclaration *instance)

{
  size_t *psVar1;
  bool bVar2;
  Expression *pEVar3;
  Namespace *pNVar4;
  pool_ptr<soul::AST::Namespace> target;
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> specialisationArgs;
  pool_ptr<soul::AST::Namespace> local_128;
  pool_ptr<soul::AST::Expression> local_120;
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> local_118;
  CompileMessage local_e0;
  CompileMessage local_a8;
  IdentifierPath local_70;
  
  RewritingASTVisitor::visit((RewritingASTVisitor *)this,instance);
  if ((instance->resolvedNamespace).object != (Namespace *)0x0) {
    return instance;
  }
  if ((instance->targetNamespace).object == (Expression *)0x0) {
    return instance;
  }
  local_120.object = (instance->specialisationArgs).object;
  AST::CommaSeparatedList::getAsExpressionList(&local_118,&local_120);
  pEVar3 = pool_ptr<soul::AST::Expression>::operator->(&instance->targetNamespace);
  (*(pEVar3->super_Statement).super_ASTObject._vptr_ASTObject[7])(&local_128,pEVar3);
  if (local_128.object == (Namespace *)0x0) {
    if ((this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.ignoreErrors ==
        false) {
      pEVar3 = pool_ptr<soul::AST::Expression>::operator->(&instance->targetNamespace);
      Errors::expectedNamespaceName<>();
      AST::Context::throwError(&(pEVar3->super_Statement).super_ASTObject.context,&local_e0,false);
    }
  }
  else {
    pNVar4 = pool_ptr<soul::AST::Namespace>::operator->(&local_128);
    bVar2 = ModuleInstanceResolver::validateSpecialisationArgs
                      (&this->super_ModuleInstanceResolver,&local_118,
                       &(pNVar4->super_ModuleBase).specialisationParams,false);
    if (!bVar2) {
      pNVar4 = pool_ptr<soul::AST::Namespace>::operator->(&local_128);
      (*(pNVar4->super_ModuleBase).super_ASTObject._vptr_ASTObject[0xe])(&local_70,pNVar4);
      Errors::wrongNumArgsForNamespace<soul::IdentifierPath>(&local_a8,&local_70);
      AST::Context::throwError(&(instance->super_ASTObject).context,&local_a8,false);
    }
    pNVar4 = pool_ptr<soul::AST::Namespace>::operator->(&local_128);
    bVar2 = ModuleInstanceResolver::canResolveAllSpecialisationArgs
                      (&this->super_ModuleInstanceResolver,&local_118,
                       &(pNVar4->super_ModuleBase).specialisationParams);
    if (bVar2) {
      pNVar4 = pool_ptr<soul::AST::Namespace>::operator*(&local_128);
      pNVar4 = ModuleInstanceResolver::getOrAddNamespaceSpecialisation
                         (&this->super_ModuleInstanceResolver,pNVar4,&local_118);
      (instance->resolvedNamespace).object = pNVar4;
      psVar1 = &(this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.
                super_RewritingASTVisitor.itemsReplaced;
      *psVar1 = *psVar1 + 1;
      goto LAB_00249011;
    }
  }
  psVar1 = &(this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.numFails;
  *psVar1 = *psVar1 + 1;
LAB_00249011:
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::clear(&local_118);
  return instance;
}

Assistant:

AST::NamespaceAliasDeclaration& visit (AST::NamespaceAliasDeclaration& instance) override
        {
            super::visit (instance);

            if (instance.isResolved())
                return instance;

            if (instance.targetNamespace == nullptr)
                return instance;

            auto specialisationArgs = AST::CommaSeparatedList::getAsExpressionList (instance.specialisationArgs);

            if (auto target = instance.targetNamespace->getAsNamespace())
            {
                if (! validateSpecialisationArgs (specialisationArgs, target->specialisationParams, false))
                    instance.context.throwError (Errors::wrongNumArgsForNamespace (target->getFullyQualifiedDisplayPath()));

                if (canResolveAllSpecialisationArgs (specialisationArgs, target->specialisationParams))
                {
                    instance.resolvedNamespace = getOrAddNamespaceSpecialisation (*target, specialisationArgs);
                    ++itemsReplaced;
                    return instance;
                }
            }
            else
            {
                if (! ignoreErrors)
                    instance.targetNamespace->context.throwError (Errors::expectedNamespaceName());
            }

            ++numFails;
            return instance;
        }